

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void * Map_Check(Map *tree,void *str,size_t size)

{
  Map *pMVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = uVar2;
  if (size != 0) {
    do {
      pMVar1 = tree->delta[*(byte *)((long)str + uVar2)];
      uVar3 = uVar2;
      if (pMVar1 == (Map *)0x0) break;
      uVar2 = uVar2 + 1;
      uVar3 = size;
      tree = pMVar1;
    } while (size != uVar2);
  }
  if (size <= uVar3) {
    return tree->ID;
  }
  return (void *)0x0;
}

Assistant:

void* Map_Check(Map *tree, void *str,size_t size)
{
	size_t temp;
	Map_Scour(tree,str,size,&temp,&tree);

	if(temp<size)
	{
		return NULL;	
	}else
	{
		return tree->ID; //this has been set to be the last reached node
	}
}